

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * lest::make_value_string<unsigned_long>(string *__return_storage_ptr__,unsigned_long *value)

{
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto make_value_string( T const & value ) -> std::string
{
    std::ostringstream os; os << value; return os.str();
}